

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPointCloudShape.cpp
# Opt level: O1

void __thiscall
cbtConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtConvexPointCloudShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,
          int numVectors)

{
  cbtVector3 *pcVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  cbtScalar *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  
  if (0 < numVectors) {
    uVar3 = 0;
    do {
      pcVar1 = this->m_unscaledPoints;
      if ((long)this->m_numPoints < 1) {
        uVar5 = 0xffffffff;
        auVar8 = ZEXT1664(SUB6416(ZEXT464(0xff7fffff),0));
      }
      else {
        pcVar4 = pcVar1->m_floats + 2;
        uVar6 = 0xffffffff;
        uVar7 = 0;
        auVar8 = ZEXT1664(SUB6416(ZEXT464(0xff7fffff),0));
        do {
          auVar2 = vfmadd231ss_fma(ZEXT416((uint)(vectors[uVar3].m_floats[1] *
                                                  *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x20 *
                                                 pcVar4[-1])),
                                   ZEXT416((uint)(vectors[uVar3].m_floats[0] *
                                                 *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.super_cbtConvexShape.
                                                  super_cbtCollisionShape.field_0x1c)),
                                   ZEXT416((uint)((cbtVector3 *)(pcVar4 + -2))->m_floats[0]));
          auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(vectors[uVar3].m_floats[2] *
                                                        *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x24)),
                                   ZEXT416((uint)*pcVar4));
          if (auVar8._0_4_ < auVar2._0_4_) {
            uVar6 = uVar7 & 0xffffffff;
          }
          uVar5 = (uint)uVar6;
          auVar2 = vmaxss_avx(auVar2,auVar8._0_16_);
          auVar8 = ZEXT1664(auVar2);
          uVar7 = uVar7 + 1;
          pcVar4 = pcVar4 + 4;
        } while ((long)this->m_numPoints != uVar7);
      }
      supportVerticesOut[uVar3].m_floats[3] = -1e+18;
      if (-1 < (int)uVar5) {
        auVar2 = vinsertps_avx(ZEXT416((uint)(pcVar1[uVar5].m_floats[0] *
                                             *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.super_cbtConvexShape.
                                                  super_cbtCollisionShape.field_0x1c)),
                               ZEXT416((uint)(pcVar1[uVar5].m_floats[1] *
                                             *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x20)),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)(pcVar1[uVar5].m_floats[2] *
                                                    *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x24)),0x28);
        *(undefined1 (*) [16])supportVerticesOut[uVar3].m_floats = auVar2;
        supportVerticesOut[uVar3].m_floats[3] = auVar8._0_4_;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)numVectors);
  }
  return;
}

Assistant:

void cbtConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
{
	for (int j = 0; j < numVectors; j++)
	{
		const cbtVector3& vec = vectors[j] * m_localScaling;  // dot( a*c, b) = dot(a, b*c)
		cbtScalar maxDot;
		int index = (int)vec.maxDot(&m_unscaledPoints[0], m_numPoints, maxDot);
		supportVerticesOut[j][3] = cbtScalar(-BT_LARGE_FLOAT);
		if (0 <= index)
		{
			//WARNING: don't swap next lines, the w component would get overwritten!
			supportVerticesOut[j] = getScaledPoint(index);
			supportVerticesOut[j][3] = maxDot;
		}
	}
}